

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::bindRenderbuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  Renderbuffer *pRVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  pair<unsigned_int,_sglr::rc::Renderbuffer_*> local_28;
  
  if (target != 0x8d41) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (name == 0) {
    pRVar4 = (Renderbuffer *)0x0;
  }
  else {
    p_Var5 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var2 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = &p_Var2->_M_header;
      do {
        bVar6 = p_Var5[1]._M_color < name;
        if (!bVar6) {
          p_Var3 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[bVar6];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var3[1]._M_color <= name)) &&
         (pRVar4 = (Renderbuffer *)p_Var3[1]._M_parent, pRVar4 != (Renderbuffer *)0x0))
      goto LAB_0189b79a;
    }
    pRVar4 = (Renderbuffer *)operator_new(0x38);
    (pRVar4->super_NamedObject).m_name = name;
    (pRVar4->super_NamedObject).m_refCount = 1;
    (pRVar4->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__Renderbuffer_0217dad8;
    tcu::TextureLevel::TextureLevel(&pRVar4->m_data);
    local_28.first = (pRVar4->super_NamedObject).m_name;
    if ((this->m_renderbuffers).m_lastName < local_28.first) {
      (this->m_renderbuffers).m_lastName = local_28.first;
    }
    local_28.second = pRVar4;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Renderbuffer*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>>
                *)&(this->m_renderbuffers).m_objects,&local_28);
  }
LAB_0189b79a:
  if (this->m_renderbufferBinding != (Renderbuffer *)0x0) {
    rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
              (&this->m_renderbuffers,this->m_renderbufferBinding);
  }
  if (pRVar4 != (Renderbuffer *)0x0) {
    piVar1 = &(pRVar4->super_NamedObject).m_refCount;
    *piVar1 = *piVar1 + 1;
  }
  this->m_renderbufferBinding = pRVar4;
  return;
}

Assistant:

void ReferenceContext::bindRenderbuffer (deUint32 target, deUint32 name)
{
	Renderbuffer* rbo = DE_NULL;

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		rbo = m_renderbuffers.find(name);
		if (!rbo)
		{
			rbo = new Renderbuffer(name);
			m_renderbuffers.insert(rbo);
		}
	}

	// Remove old reference
	if (m_renderbufferBinding)
		m_renderbuffers.releaseReference(m_renderbufferBinding);

	// Create new reference
	if (rbo)
		m_renderbuffers.acquireReference(rbo);

	m_renderbufferBinding = rbo;
}